

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_16bit_4chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  long in_RDI;
  int x;
  uint64_t *outall;
  int y;
  anon_union_8_2_471eed58 combined;
  int linc0;
  int h;
  int w;
  uint8_t *out0;
  uint16_t *in3;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  undefined4 local_64;
  undefined4 local_54;
  undefined8 local_38;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0xc);
  iVar2 = *(int *)(in_RDI + 0x2c);
  iVar3 = *(int *)(in_RDI + 100);
  iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0x24);
  local_38 = *(long *)(*(long *)(in_RDI + 8) + 0x28);
  for (local_54 = *(int *)(in_RDI + 0x60); local_54 < iVar2 - iVar3; local_54 = local_54 + 1) {
    for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
      uVar5 = one_to_native16(0);
      uVar6 = one_to_native16(0);
      uVar7 = one_to_native16(0);
      uVar8 = one_to_native16(0);
      *(ulong *)(local_38 + (long)local_64 * 8) =
           CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(uVar6,uVar5)));
    }
    local_38 = local_38 + iVar4;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;
    /* TODO: can do this with sse and do 2 outpixels at once */
    union
    {
        struct
        {
            uint16_t a;
            uint16_t b;
            uint16_t g;
            uint16_t r;
        };
        uint64_t allc;
    } combined;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 8;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint64_t* outall = (uint64_t*) out0;
        in0              = (const uint16_t*) srcbuffer;
        in1              = in0 + w;
        in2              = in1 + w;
        in3              = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            combined.a = one_to_native16 (in0[x]);
            combined.b = one_to_native16 (in1[x]);
            combined.g = one_to_native16 (in2[x]);
            combined.r = one_to_native16 (in3[x]);
            outall[x]  = combined.allc;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}